

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# current_query_id.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::CurrentQueryIdBind
          (ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  idx_t value;
  element_type *peVar1;
  Value query_id;
  LogicalType LStack_c8;
  LogicalType local_b0;
  Value local_98;
  Value local_58;
  
  LogicalType::LogicalType(&local_b0,SQLNULL);
  Value::Value(&local_98,&local_b0);
  LogicalType::~LogicalType(&local_b0);
  if (bound_function[1].deserialize == (function_deserialize_t)0x0) {
    LogicalType::LogicalType(&LStack_c8,SQLNULL);
    Value::Value(&local_58,&LStack_c8);
    Value::operator=(&local_98,&local_58);
    Value::~Value(&local_58);
    LogicalType::~LogicalType(&LStack_c8);
  }
  else {
    value = TransactionContext::GetActiveQuery
                      ((TransactionContext *)&bound_function[1].get_modified_databases);
    Value::UBIGINT(&local_58,value);
    Value::operator=(&local_98,&local_58);
    Value::~Value(&local_58);
  }
  peVar1 = (element_type *)operator_new(0x48);
  Value::Value(&local_58,&local_98);
  *(undefined ***)&(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ =
       &PTR__CurrentQueryIdData_02444370;
  Value::Value((Value *)((long)&(peVar1->super_enable_shared_from_this<duckdb::ClientContext>).
                                __weak_this_ + 8),&local_58);
  Value::~Value(&local_58);
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  Value::~Value(&local_98);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)context;
}

Assistant:

unique_ptr<FunctionData> CurrentQueryIdBind(ClientContext &context, ScalarFunction &bound_function,
                                            vector<unique_ptr<Expression>> &arguments) {
	Value query_id;
	if (context.transaction.HasActiveTransaction()) {
		query_id = Value::UBIGINT(context.transaction.GetActiveQuery());
	} else {
		query_id = Value();
	}
	return make_uniq<CurrentQueryIdData>(query_id);
}